

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock_test.cc
# Opt level: O3

void subblock_test(void)

{
  bool bVar1;
  bool bVar2;
  btree_result bVar3;
  int iVar4;
  btree_kv_ops *kv_ops;
  filemgr_ops *pfVar5;
  filemgr *pfVar6;
  btree_blk_ops *pbVar7;
  bid_t bVar8;
  size_t sVar9;
  btree_kv_ops *pbVar10;
  long *extraout_RDX;
  btree *pbVar11;
  ulong uVar12;
  char *pcVar13;
  ulong *key_buf;
  btreeblk_handle *handle;
  uint uVar14;
  btree *unaff_R12;
  uint uVar15;
  long lVar16;
  uint uVar17;
  undefined8 uVar18;
  long lVar19;
  ulong uVar20;
  filemgr_open_result fVar21;
  ulong uStack_1478;
  ulong uStack_1470;
  btree_kv_ops *pbStack_1468;
  filemgr *pfStack_1460;
  undefined1 auStack_1458 [224];
  btree bStack_1378;
  timeval tStack_1340;
  filemgr_config fStack_1330;
  btree_kv_ops *pbStack_12c8;
  btree *pbStack_12c0;
  ulong local_1290;
  btree_meta meta;
  btree btree;
  btreeblk_handle bhandle;
  filemgr_config local_11a8;
  timeval __test_begin;
  char keybuf [256];
  char valuebuf [256];
  char temp [256];
  btree btree_arr [64];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  local_11a8.flag = 0;
  local_11a8.chunksize = 0;
  local_11a8.prefetch_duration = 0;
  local_11a8.encryption_key.bytes[0] = '\0';
  local_11a8.encryption_key.bytes[1] = '\0';
  local_11a8.encryption_key.bytes[2] = '\0';
  local_11a8.encryption_key.bytes[3] = '\0';
  local_11a8.encryption_key.bytes[4] = '\0';
  local_11a8.encryption_key.bytes[5] = '\0';
  local_11a8.encryption_key.bytes[6] = '\0';
  local_11a8.encryption_key.bytes[7] = '\0';
  local_11a8.encryption_key.bytes[8] = '\0';
  local_11a8.encryption_key.bytes[9] = '\0';
  local_11a8.encryption_key.bytes[10] = '\0';
  local_11a8.encryption_key.bytes[0xb] = '\0';
  local_11a8.encryption_key.bytes[0xc] = '\0';
  local_11a8.encryption_key.bytes[0xd] = '\0';
  local_11a8.encryption_key.bytes[0xe] = '\0';
  local_11a8.encryption_key.bytes[0xf] = '\0';
  local_11a8.encryption_key.bytes[0x10] = '\0';
  local_11a8.encryption_key.bytes[0x11] = '\0';
  local_11a8.encryption_key.bytes[0x12] = '\0';
  local_11a8.encryption_key.bytes[0x13] = '\0';
  local_11a8.encryption_key.bytes[0x14] = '\0';
  local_11a8.encryption_key.bytes[0x15] = '\0';
  local_11a8.encryption_key.bytes[0x16] = '\0';
  local_11a8.encryption_key.bytes[0x17] = '\0';
  local_11a8.encryption_key.bytes[0x18] = '\0';
  local_11a8.encryption_key.bytes[0x19] = '\0';
  local_11a8.encryption_key.bytes[0x1a] = '\0';
  local_11a8.encryption_key.bytes[0x1b] = '\0';
  local_11a8.encryption_key.bytes[0x1c] = '\0';
  local_11a8.encryption_key.bytes[0x1d] = '\0';
  local_11a8.encryption_key.bytes[0x1e] = '\0';
  local_11a8.encryption_key.bytes[0x1f] = '\0';
  local_11a8.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  local_11a8.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  local_11a8.do_not_cache_doc_blocks = false;
  local_11a8._89_3_ = 0;
  local_11a8.num_blocks_readahead = 0;
  local_11a8.blocksize = 0x1000;
  local_11a8.ncacheblock = 0;
  local_11a8.options = '\b';
  local_11a8.seqtree_opt = '\0';
  local_11a8._18_6_ = 0;
  local_11a8.num_wal_shards = 8;
  local_11a8.num_bcache_shards = 0;
  local_11a8.encryption_key.algorithm = 0;
  kv_ops = btree_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  system("rm -rf  btreeblock_testfile");
  pfVar5 = get_filemgr_ops();
  fVar21 = filemgr_open("./btreeblock_testfile",pfVar5,&local_11a8,(err_log_callback *)0x0);
  pfVar6 = fVar21.file;
  meta.data = malloc(0x1000);
  meta.size = 0x78;
  pbVar10 = (btree_kv_ops *)&bhandle;
  btreeblk_init((btreeblk_handle *)pbVar10,pfVar6,0x1000);
  pbVar7 = btreeblk_get_ops();
  pbStack_12c0 = (btree *)0x105380;
  btree_init(&btree,pbVar10,pbVar7,kv_ops,0x1000,'\b','\b',0,&meta);
  bVar8 = btree.root_bid;
  if ((btree.root_bid & 0xff000000000000) == 0) {
    pbVar10 = (btree_kv_ops *)keybuf;
    subblock_test();
    bVar8 = keybuf._0_8_;
  }
  if ((bVar8 & 0xe0000000000000) == 0x40000000000000) {
    pbVar10 = (btree_kv_ops *)&bhandle;
    btreeblk_free((btreeblk_handle *)pbVar10);
    meta.size = 0xfa;
    btreeblk_init((btreeblk_handle *)pbVar10,pfVar6,0x1000);
    pbVar7 = btreeblk_get_ops();
    unaff_R12 = &btree;
    pbStack_12c0 = (btree *)0x10541f;
    btree_init(unaff_R12,pbVar10,pbVar7,kv_ops,0x1000,'\b','\b',0,&meta);
    bVar8 = btree.root_bid;
    if ((btree.root_bid & 0xff000000000000) == 0) {
      pbVar10 = (btree_kv_ops *)keybuf;
      subblock_test();
      bVar8 = keybuf._0_8_;
    }
    if ((bVar8 & 0xe0000000000000) != 0x60000000000000) goto LAB_00106140;
    pbVar10 = (btree_kv_ops *)&bhandle;
    btreeblk_free((btreeblk_handle *)pbVar10);
    meta.size = 0x1fe;
    btreeblk_init((btreeblk_handle *)pbVar10,pfVar6,0x1000);
    pbVar7 = btreeblk_get_ops();
    unaff_R12 = &btree;
    pbStack_12c0 = (btree *)0x1054b1;
    btree_init(unaff_R12,pbVar10,pbVar7,kv_ops,0x1000,'\b','\b',0,&meta);
    bVar8 = btree.root_bid;
    if ((btree.root_bid & 0xff000000000000) == 0) {
      pbVar10 = (btree_kv_ops *)keybuf;
      subblock_test();
      bVar8 = keybuf._0_8_;
    }
    if ((bVar8 & 0xe0000000000000) != 0x80000000000000) goto LAB_00106145;
    pbVar10 = (btree_kv_ops *)&bhandle;
    btreeblk_free((btreeblk_handle *)pbVar10);
    meta.size = 0x3fc;
    btreeblk_init((btreeblk_handle *)pbVar10,pfVar6,0x1000);
    pbVar7 = btreeblk_get_ops();
    unaff_R12 = &btree;
    pbStack_12c0 = (btree *)0x105543;
    btree_init(unaff_R12,pbVar10,pbVar7,kv_ops,0x1000,'\b','\b',0,&meta);
    bVar8 = btree.root_bid;
    if ((btree.root_bid & 0xff000000000000) == 0) {
      pbVar10 = (btree_kv_ops *)keybuf;
      subblock_test();
      bVar8 = keybuf._0_8_;
    }
    if ((bVar8 & 0xe0000000000000) != 0xa0000000000000) goto LAB_0010614a;
    btreeblk_free(&bhandle);
    meta.size = 0x7f8;
    btreeblk_init(&bhandle,pfVar6,0x1000);
    pbVar7 = btreeblk_get_ops();
    unaff_R12 = &btree;
    pbStack_12c0 = (btree *)0x1055d5;
    btree_init(unaff_R12,&bhandle,pbVar7,kv_ops,0x1000,'\b','\b',0,&meta);
    if ((btree.root_bid & 0xff000000000000) != 0) {
      subblock_test();
    }
    btreeblk_free(&bhandle);
    meta.size = 0xffa;
    btreeblk_init(&bhandle,pfVar6,0x1000);
    pbVar7 = btreeblk_get_ops();
    pbStack_12c0 = (btree *)0x105640;
    bVar3 = btree_init(&btree,&bhandle,pbVar7,kv_ops,0x1000,'\b','\b',0,&meta);
    if (bVar3 == BTREE_RESULT_FAIL) {
      btreeblk_free(&bhandle);
      uVar14 = 1;
      filemgr_close(pfVar6,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      free(meta.data);
      system("rm -rf  btreeblock_testfile");
      pfVar5 = get_filemgr_ops();
      fVar21 = filemgr_open("./btreeblock_testfile",pfVar5,&local_11a8,(err_log_callback *)0x0);
      btreeblk_init(&bhandle,fVar21.file,0x1000);
      pbVar7 = btreeblk_get_ops();
      pbStack_12c0 = (btree *)0x1056ed;
      btree_init(&btree,&bhandle,pbVar7,kv_ops,0x1000,'\b','\b',0,(btree_meta *)0x0);
      uVar12 = 0;
      do {
        sprintf(keybuf,"%08d",uVar12);
        sprintf(valuebuf,"%08x",uVar12);
        btree_insert(&btree,keybuf,valuebuf);
        btreeblk_end(&bhandle);
        uVar20 = 0;
        do {
          sprintf(keybuf,"%08d",uVar20);
          sprintf(valuebuf,"%08x",uVar20);
          btree_find(&btree,keybuf,temp);
          btreeblk_end(&bhandle);
          sVar9 = strlen(valuebuf);
          iVar4 = bcmp(valuebuf,temp,sVar9);
          if (iVar4 != 0) {
            subblock_test();
          }
          uVar17 = (int)uVar20 + 1;
          uVar20 = (ulong)uVar17;
        } while (uVar14 != uVar17);
        uVar17 = (int)uVar12 + 1;
        uVar12 = (ulong)uVar17;
        uVar14 = uVar14 + 1;
      } while (uVar17 != 0x100);
      btreeblk_free(&bhandle);
      uVar14 = 1;
      filemgr_close(fVar21.file,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      system("rm -rf  btreeblock_testfile");
      pfVar5 = get_filemgr_ops();
      fVar21 = filemgr_open("./btreeblock_testfile",pfVar5,&local_11a8,(err_log_callback *)0x0);
      pfVar6 = fVar21.file;
      btreeblk_init(&bhandle,pfVar6,0x1000);
      pbVar7 = btreeblk_get_ops();
      pbStack_12c0 = (btree *)0x10587a;
      btree_init(&btree,&bhandle,pbVar7,kv_ops,0x1000,'\b','\b',0,(btree_meta *)0x0);
      uVar12 = 0;
      do {
        sprintf(keybuf,"%08d",uVar12);
        sprintf(valuebuf,"%08x",uVar12);
        btree_insert(&btree,keybuf,valuebuf);
        btreeblk_end(&bhandle);
        filemgr_commit(pfVar6,true,(err_log_callback *)0x0);
        uVar20 = 0;
        do {
          sprintf(keybuf,"%08d",uVar20);
          sprintf(valuebuf,"%08x",uVar20);
          btree_find(&btree,keybuf,temp);
          btreeblk_end(&bhandle);
          sVar9 = strlen(valuebuf);
          iVar4 = bcmp(valuebuf,temp,sVar9);
          if (iVar4 != 0) {
            subblock_test();
          }
          uVar17 = (int)uVar20 + 1;
          uVar20 = (ulong)uVar17;
        } while (uVar14 != uVar17);
        uVar17 = (int)uVar12 + 1;
        uVar12 = (ulong)uVar17;
        uVar14 = uVar14 + 1;
      } while (uVar17 != 0x100);
      btreeblk_free(&bhandle);
      local_1290._0_4_ = 1;
      filemgr_close(pfVar6,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      system("rm -rf  btreeblock_testfile");
      pfVar5 = get_filemgr_ops();
      fVar21 = filemgr_open("./btreeblock_testfile",pfVar5,&local_11a8,(err_log_callback *)0x0);
      btreeblk_init(&bhandle,fVar21.file,0x1000);
      pbVar7 = btreeblk_get_ops();
      pbStack_12c0 = (btree *)0x105a29;
      btree_init(btree_arr,&bhandle,pbVar7,kv_ops,0x1000,'\b','\b',0,(btree_meta *)0x0);
      pbVar7 = btreeblk_get_ops();
      pbStack_12c0 = (btree *)0x105a61;
      btree_init(btree_arr + 1,&bhandle,pbVar7,kv_ops,0x1000,'\b','\b',0,(btree_meta *)0x0);
      uVar14 = 0;
      do {
        pbVar11 = btree_arr;
        uVar18 = 0;
        bVar1 = true;
        do {
          bVar2 = bVar1;
          uVar12 = 0;
          sprintf(keybuf,"%02d%06d",uVar18,(ulong)uVar14);
          sprintf(valuebuf,"%02d%06x",uVar18,(ulong)uVar14);
          btree_insert(pbVar11,keybuf,valuebuf);
          btreeblk_end(&bhandle);
          do {
            sprintf(keybuf,"%02d%06d",uVar18,uVar12);
            sprintf(valuebuf,"%02d%06x",uVar18);
            btree_find(pbVar11,keybuf,temp);
            btreeblk_end(&bhandle);
            sVar9 = strlen(valuebuf);
            iVar4 = bcmp(valuebuf,temp,sVar9);
            if (iVar4 != 0) {
              subblock_test();
            }
            uVar17 = (int)uVar12 + 1;
            uVar12 = (ulong)uVar17;
          } while ((uint)local_1290 != uVar17);
          uVar18 = 1;
          pbVar11 = btree_arr + 1;
          bVar1 = false;
        } while (bVar2);
        uVar14 = uVar14 + 1;
        local_1290._0_4_ = (uint)local_1290 + 1;
      } while (uVar14 != 0x100);
      btreeblk_free(&bhandle);
      uVar14 = 1;
      filemgr_close(fVar21.file,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      system("rm -rf  btreeblock_testfile");
      pfVar5 = get_filemgr_ops();
      fVar21 = filemgr_open("./btreeblock_testfile",pfVar5,&local_11a8,(err_log_callback *)0x0);
      pfVar6 = fVar21.file;
      btreeblk_init(&bhandle,pfVar6,0x1000);
      pbVar7 = btreeblk_get_ops();
      pbStack_12c0 = (btree *)0x105c34;
      btree_init(btree_arr,&bhandle,pbVar7,kv_ops,0x1000,'\b','\b',0,(btree_meta *)0x0);
      pbVar7 = btreeblk_get_ops();
      pbStack_12c0 = (btree *)0x105c6a;
      btree_init(btree_arr + 1,&bhandle,pbVar7,kv_ops,0x1000,'\b','\b',0,(btree_meta *)0x0);
      uVar17 = 0;
      do {
        sprintf(keybuf,"%02d%06d",0,(ulong)uVar17);
        sprintf(valuebuf,"%02d%06x",0,(ulong)uVar17);
        pbVar11 = btree_arr;
        btree_insert(pbVar11,keybuf,valuebuf);
        btreeblk_end(&bhandle);
        sprintf(keybuf,"%02d%06d",1,(ulong)uVar17);
        sprintf(valuebuf,"%02d%06x",1,(ulong)uVar17);
        btree_insert(btree_arr + 1,keybuf,valuebuf);
        btreeblk_end(&bhandle);
        filemgr_commit(pfVar6,true,(err_log_callback *)0x0);
        uVar18 = 0;
        bVar1 = true;
        do {
          bVar2 = bVar1;
          uVar12 = 0;
          do {
            sprintf(keybuf,"%02d%06d",uVar18,uVar12);
            sprintf(valuebuf,"%02d%06x",uVar18);
            btree_find(pbVar11,keybuf,temp);
            btreeblk_end(&bhandle);
            sVar9 = strlen(valuebuf);
            iVar4 = bcmp(valuebuf,temp,sVar9);
            if (iVar4 != 0) {
              subblock_test();
            }
            uVar15 = (int)uVar12 + 1;
            uVar12 = (ulong)uVar15;
          } while (uVar14 != uVar15);
          uVar18 = 1;
          pbVar11 = btree_arr + 1;
          bVar1 = false;
        } while (bVar2);
        uVar17 = uVar17 + 1;
        uVar14 = uVar14 + 1;
      } while (uVar17 != 0x100);
      btreeblk_free(&bhandle);
      lVar19 = 0;
      filemgr_close(pfVar6,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      system("rm -rf  btreeblock_testfile");
      pfVar5 = get_filemgr_ops();
      fVar21 = filemgr_open("./btreeblock_testfile",pfVar5,&local_11a8,(err_log_callback *)0x0);
      pfVar6 = fVar21.file;
      btreeblk_init(&bhandle,pfVar6,0x1000);
      do {
        pbVar7 = btreeblk_get_ops();
        pbStack_12c0 = (btree *)0x105e97;
        btree_init((btree *)(&btree_arr[0].ksize + lVar19),&bhandle,pbVar7,kv_ops,0x1000,'\b','\b',0
                   ,(btree_meta *)0x0);
        lVar19 = lVar19 + 0x38;
      } while (lVar19 != 0x188);
      uVar12 = 0;
      do {
        uVar14 = (0x80 << ((byte)uVar12 & 0x1f)) + -0x10 >> 4;
        if (0 < (int)uVar14) {
          uVar20 = 0;
          do {
            sprintf(keybuf,"%02d%06d",uVar12 & 0xffffffff,uVar20);
            sprintf(valuebuf,"%02d%06x",uVar12 & 0xffffffff);
            btree_insert(btree_arr + uVar12,keybuf,valuebuf);
            btreeblk_end(&bhandle);
            uVar17 = (int)uVar20 + 1;
            uVar20 = (ulong)uVar17;
          } while (uVar14 != uVar17);
        }
        filemgr_commit(pfVar6,true,(err_log_callback *)0x0);
        uVar12 = uVar12 + 1;
      } while (uVar12 != 7);
      btreeblk_free(&bhandle);
      lVar19 = 0;
      filemgr_close(pfVar6,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      system("rm -rf  btreeblock_testfile");
      pfVar5 = get_filemgr_ops();
      fVar21 = filemgr_open("./btreeblock_testfile",pfVar5,&local_11a8,(err_log_callback *)0x0);
      pfVar6 = fVar21.file;
      btreeblk_init(&bhandle,pfVar6,0x1000);
      do {
        pbVar7 = btreeblk_get_ops();
        pbStack_12c0 = (btree *)0x105ff4;
        btree_init((btree *)(&btree_arr[0].ksize + lVar19),&bhandle,pbVar7,kv_ops,0x1000,'\b','\b',0
                   ,(btree_meta *)0x0);
        lVar19 = lVar19 + 0x38;
      } while (lVar19 != 0x188);
      local_1290 = 0;
      do {
        uVar14 = (0x80 << ((byte)local_1290 & 0x1f)) + -0x10 >> 4;
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            sprintf(keybuf,"%02d%06d",local_1290 & 0xffffffff,(ulong)uVar17);
            sprintf(valuebuf,"%02d%06x",local_1290 & 0xffffffff,(ulong)uVar17);
            btree_insert(btree_arr + local_1290,keybuf,valuebuf);
            btreeblk_end(&bhandle);
            filemgr_commit(pfVar6,true,(err_log_callback *)0x0);
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        local_1290 = local_1290 + 1;
      } while (local_1290 != 7);
      btreeblk_free(&bhandle);
      filemgr_close(pfVar6,true,(char *)0x0,(err_log_callback *)0x0);
      filemgr_shutdown();
      free(kv_ops);
      pcVar13 = "%s PASSED\n";
      if (subblock_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar13,"subblock test");
      return;
    }
  }
  else {
    subblock_test();
LAB_00106140:
    subblock_test();
LAB_00106145:
    subblock_test();
LAB_0010614a:
    kv_ops = pbVar10;
    subblock_test();
  }
  subblock_test();
  pbStack_12c8 = kv_ops;
  pbStack_12c0 = unaff_R12;
  gettimeofday(&tStack_1340,(__timezone_ptr_t)0x0);
  system("rm -rf  btreeblock_testfile");
  memleak_start();
  fStack_1330.flag = 0;
  fStack_1330.chunksize = 0;
  fStack_1330.prefetch_duration = 0;
  fStack_1330.encryption_key.bytes[0] = '\0';
  fStack_1330.encryption_key.bytes[1] = '\0';
  fStack_1330.encryption_key.bytes[2] = '\0';
  fStack_1330.encryption_key.bytes[3] = '\0';
  fStack_1330.encryption_key.bytes[4] = '\0';
  fStack_1330.encryption_key.bytes[5] = '\0';
  fStack_1330.encryption_key.bytes[6] = '\0';
  fStack_1330.encryption_key.bytes[7] = '\0';
  fStack_1330.num_keeping_headers.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  fStack_1330.do_not_cache_doc_blocks = false;
  fStack_1330._89_3_ = 0;
  fStack_1330.num_blocks_readahead = 0;
  fStack_1330.encryption_key.bytes[0x18] = '\0';
  fStack_1330.encryption_key.bytes[0x19] = '\0';
  fStack_1330.encryption_key.bytes[0x1a] = '\0';
  fStack_1330.encryption_key.bytes[0x1b] = '\0';
  fStack_1330.encryption_key.bytes[0x1c] = '\0';
  fStack_1330.encryption_key.bytes[0x1d] = '\0';
  fStack_1330.encryption_key.bytes[0x1e] = '\0';
  fStack_1330.encryption_key.bytes[0x1f] = '\0';
  fStack_1330.block_reusing_threshold.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  fStack_1330.encryption_key.bytes[8] = '\0';
  fStack_1330.encryption_key.bytes[9] = '\0';
  fStack_1330.encryption_key.bytes[10] = '\0';
  fStack_1330.encryption_key.bytes[0xb] = '\0';
  fStack_1330.encryption_key.bytes[0xc] = '\0';
  fStack_1330.encryption_key.bytes[0xd] = '\0';
  fStack_1330.encryption_key.bytes[0xe] = '\0';
  fStack_1330.encryption_key.bytes[0xf] = '\0';
  fStack_1330.encryption_key.bytes[0x10] = '\0';
  fStack_1330.encryption_key.bytes[0x11] = '\0';
  fStack_1330.encryption_key.bytes[0x12] = '\0';
  fStack_1330.encryption_key.bytes[0x13] = '\0';
  fStack_1330.encryption_key.bytes[0x14] = '\0';
  fStack_1330.encryption_key.bytes[0x15] = '\0';
  fStack_1330.encryption_key.bytes[0x16] = '\0';
  fStack_1330.encryption_key.bytes[0x17] = '\0';
  fStack_1330.blocksize = 0x100;
  fStack_1330.ncacheblock = 0;
  fStack_1330.options = '\b';
  fStack_1330.seqtree_opt = '\0';
  fStack_1330._18_6_ = 0;
  fStack_1330.num_wal_shards = 8;
  fStack_1330.num_bcache_shards = 0;
  fStack_1330.encryption_key.algorithm = 0;
  pfVar5 = get_filemgr_ops();
  fVar21 = filemgr_open("./btreeblock_testfile",pfVar5,&fStack_1330,(err_log_callback *)0x0);
  pfStack_1460 = fVar21.file;
  btreeblk_init((btreeblk_handle *)(auStack_1458 + 0x68),pfStack_1460,0x100);
  pbVar10 = btree_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  pbVar7 = btreeblk_get_ops();
  pbStack_1468 = pbVar10;
  btree_init(&bStack_1378,(btreeblk_handle *)(auStack_1458 + 0x68),pbVar7,pbVar10,0x100,'\b','\b',0,
             (btree_meta *)0x0);
  lVar16 = 0x1e;
  lVar19 = -0x6000000000000000;
  uVar20 = 0xa00000000000;
  uVar12 = 0xa000000000000;
  do {
    uStack_1470 = (uVar20 & 0xffff000000000000) + lVar19;
    uStack_1478 = uVar12;
    btree_insert(&bStack_1378,&uStack_1470,&uStack_1478);
    btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
    lVar19 = lVar19 + 0x1000000000000000;
    uVar20 = uVar20 + 0x100000000000;
    uVar12 = uVar12 + 0x1000000000000;
    lVar16 = lVar16 + -1;
  } while (lVar16 != 0);
  btree_iterator_init(&bStack_1378,(btree_iterator *)auStack_1458,(void *)0x0);
  key_buf = &uStack_1470;
  bVar3 = btree_next((btree_iterator *)auStack_1458,key_buf,&uStack_1478);
  if (bVar3 == BTREE_RESULT_SUCCESS) {
    uVar12 = 0xa0;
    uVar20 = 0xa00;
    lVar19 = 0x1e;
    do {
      btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
      uStack_1470 = uStack_1470 >> 0x38 | (uStack_1470 & 0xff000000000000) >> 0x28 |
                    (uStack_1470 & 0xff0000000000) >> 0x18 | (uStack_1470 & 0xff00000000) >> 8 |
                    (uStack_1470 & 0xff000000) << 8 | (uStack_1470 & 0xff0000) << 0x18 |
                    (uStack_1470 & 0xff00) << 0x28 | uStack_1470 << 0x38;
      uStack_1478 = uStack_1478 >> 0x38 | (uStack_1478 & 0xff000000000000) >> 0x28 |
                    (uStack_1478 & 0xff0000000000) >> 0x18 | (uStack_1478 & 0xff00000000) >> 8 |
                    (uStack_1478 & 0xff000000) << 8 | (uStack_1478 & 0xff0000) << 0x18 |
                    (uStack_1478 & 0xff00) << 0x28 | uStack_1478 << 0x38;
      if (uVar12 != uStack_1470) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                ,0x278);
        btree_reverse_iterator_test()::__test_pass = '\x01';
        if (uVar12 != uStack_1470) goto LAB_00106b15;
      }
      if (uVar20 != uStack_1478) {
        btree_reverse_iterator_test();
      }
      key_buf = &uStack_1470;
      bVar3 = btree_next((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
      uVar12 = uVar12 + 0x10;
      uVar20 = uVar20 + 0x100;
      lVar19 = lVar19 + -1;
    } while (bVar3 == BTREE_RESULT_SUCCESS);
    btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
    btree_iterator_free((btree_iterator *)auStack_1458);
    if (lVar19 != 0) goto LAB_00106c05;
    uStack_1470 = 0x1027000000000000;
    btree_iterator_init(&bStack_1378,(btree_iterator *)auStack_1458,&uStack_1470);
    bVar3 = btree_next((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
    if (bVar3 == BTREE_RESULT_SUCCESS) {
      do {
        btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
        uStack_1470 = uStack_1470 >> 0x38 | (uStack_1470 & 0xff000000000000) >> 0x28 |
                      (uStack_1470 & 0xff0000000000) >> 0x18 | (uStack_1470 & 0xff00000000) >> 8 |
                      (uStack_1470 & 0xff000000) << 8 | (uStack_1470 & 0xff0000) << 0x18 |
                      (uStack_1470 & 0xff00) << 0x28 | uStack_1470 << 0x38;
        uStack_1478 = uStack_1478 >> 0x38 | (uStack_1478 & 0xff000000000000) >> 0x28 |
                      (uStack_1478 & 0xff0000000000) >> 0x18 | (uStack_1478 & 0xff00000000) >> 8 |
                      (uStack_1478 & 0xff000000) << 8 | (uStack_1478 & 0xff0000) << 0x18 |
                      (uStack_1478 & 0xff00) << 0x28 | uStack_1478 << 0x38;
        bVar3 = btree_next((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
      } while (bVar3 == BTREE_RESULT_SUCCESS);
    }
    btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
    btree_iterator_free((btree_iterator *)auStack_1458);
    btree_iterator_init(&bStack_1378,(btree_iterator *)auStack_1458,(void *)0x0);
    bVar3 = btree_prev((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
    if (bVar3 == BTREE_RESULT_SUCCESS) {
      do {
        btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
        uStack_1470 = uStack_1470 >> 0x38 | (uStack_1470 & 0xff000000000000) >> 0x28 |
                      (uStack_1470 & 0xff0000000000) >> 0x18 | (uStack_1470 & 0xff00000000) >> 8 |
                      (uStack_1470 & 0xff000000) << 8 | (uStack_1470 & 0xff0000) << 0x18 |
                      (uStack_1470 & 0xff00) << 0x28 | uStack_1470 << 0x38;
        uStack_1478 = uStack_1478 >> 0x38 | (uStack_1478 & 0xff000000000000) >> 0x28 |
                      (uStack_1478 & 0xff0000000000) >> 0x18 | (uStack_1478 & 0xff00000000) >> 8 |
                      (uStack_1478 & 0xff000000) << 8 | (uStack_1478 & 0xff0000) << 0x18 |
                      (uStack_1478 & 0xff00) << 0x28 | uStack_1478 << 0x38;
        bVar3 = btree_prev((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
      } while (bVar3 == BTREE_RESULT_SUCCESS);
    }
    btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
    btree_iterator_free((btree_iterator *)auStack_1458);
    key_buf = &uStack_1470;
    uStack_1470 = 0x1027000000000000;
    btree_iterator_init(&bStack_1378,(btree_iterator *)auStack_1458,key_buf);
    bVar3 = btree_prev((btree_iterator *)auStack_1458,key_buf,&uStack_1478);
    if (bVar3 != BTREE_RESULT_SUCCESS) goto LAB_00106c0a;
    uVar12 = 0x270;
    uVar20 = 0x2700;
    lVar19 = 0x1e;
    do {
      btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
      uStack_1470 = uStack_1470 >> 0x38 | (uStack_1470 & 0xff000000000000) >> 0x28 |
                    (uStack_1470 & 0xff0000000000) >> 0x18 | (uStack_1470 & 0xff00000000) >> 8 |
                    (uStack_1470 & 0xff000000) << 8 | (uStack_1470 & 0xff0000) << 0x18 |
                    (uStack_1470 & 0xff00) << 0x28 | uStack_1470 << 0x38;
      uStack_1478 = uStack_1478 >> 0x38 | (uStack_1478 & 0xff000000000000) >> 0x28 |
                    (uStack_1478 & 0xff0000000000) >> 0x18 | (uStack_1478 & 0xff00000000) >> 8 |
                    (uStack_1478 & 0xff000000) << 8 | (uStack_1478 & 0xff0000) << 0x18 |
                    (uStack_1478 & 0xff00) << 0x28 | uStack_1478 << 0x38;
      if (uVar12 != uStack_1470) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                ,0x2a1);
        btree_reverse_iterator_test()::__test_pass = '\x01';
        if (uVar12 != uStack_1470) {
          __assert_fail("k == (uint64_t)(39-c)*0x10",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                        ,0x2a1,"void btree_reverse_iterator_test()");
        }
      }
      if (uVar20 != uStack_1478) {
        btree_reverse_iterator_test();
      }
      key_buf = &uStack_1470;
      bVar3 = btree_prev((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
      uVar12 = uVar12 - 0x10;
      uVar20 = uVar20 - 0x100;
      lVar19 = lVar19 + -1;
    } while (bVar3 == BTREE_RESULT_SUCCESS);
    btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
    btree_iterator_free((btree_iterator *)auStack_1458);
    if (lVar19 != 0) goto LAB_00106c21;
    key_buf = &uStack_1470;
    uStack_1470 = 0x7501000000000000;
    btree_iterator_init(&bStack_1378,(btree_iterator *)auStack_1458,key_buf);
    bVar3 = btree_prev((btree_iterator *)auStack_1458,key_buf,&uStack_1478);
    if (bVar3 != BTREE_RESULT_SUCCESS) goto LAB_00106c26;
    uVar12 = 0x170;
    uVar20 = 0x1700;
    lVar19 = 0xe;
    do {
      btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
      uStack_1470 = uStack_1470 >> 0x38 | (uStack_1470 & 0xff000000000000) >> 0x28 |
                    (uStack_1470 & 0xff0000000000) >> 0x18 | (uStack_1470 & 0xff00000000) >> 8 |
                    (uStack_1470 & 0xff000000) << 8 | (uStack_1470 & 0xff0000) << 0x18 |
                    (uStack_1470 & 0xff00) << 0x28 | uStack_1470 << 0x38;
      uStack_1478 = uStack_1478 >> 0x38 | (uStack_1478 & 0xff000000000000) >> 0x28 |
                    (uStack_1478 & 0xff0000000000) >> 0x18 | (uStack_1478 & 0xff00000000) >> 8 |
                    (uStack_1478 & 0xff000000) << 8 | (uStack_1478 & 0xff0000) << 0x18 |
                    (uStack_1478 & 0xff00) << 0x28 | uStack_1478 << 0x38;
      if (uVar12 != uStack_1470) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                ,0x2b1);
        btree_reverse_iterator_test()::__test_pass = '\x01';
        if (uVar12 != uStack_1470) {
          __assert_fail("k == (uint64_t)(0x17-c)*0x10",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                        ,0x2b1,"void btree_reverse_iterator_test()");
        }
      }
      if (uVar20 != uStack_1478) {
        btree_reverse_iterator_test();
      }
      key_buf = &uStack_1470;
      bVar3 = btree_prev((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
      uVar12 = uVar12 - 0x10;
      uVar20 = uVar20 - 0x100;
      lVar19 = lVar19 + -1;
    } while (bVar3 == BTREE_RESULT_SUCCESS);
    btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
    handle = (btreeblk_handle *)auStack_1458;
    btree_iterator_free((btree_iterator *)handle);
    if (lVar19 == 0) {
      btree_iterator_init(&bStack_1378,(btree_iterator *)auStack_1458,(void *)0x0);
      uVar12 = 0xa0;
      uVar20 = 0xa00;
      do {
        bVar3 = btree_next((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
        if (bVar3 != BTREE_RESULT_SUCCESS) {
          btree_reverse_iterator_test();
          goto LAB_00106b06;
        }
        btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
        uStack_1470 = uStack_1470 >> 0x38 | (uStack_1470 & 0xff000000000000) >> 0x28 |
                      (uStack_1470 & 0xff0000000000) >> 0x18 | (uStack_1470 & 0xff00000000) >> 8 |
                      (uStack_1470 & 0xff000000) << 8 | (uStack_1470 & 0xff0000) << 0x18 |
                      (uStack_1470 & 0xff00) << 0x28 | uStack_1470 << 0x38;
        uStack_1478 = uStack_1478 >> 0x38 | (uStack_1478 & 0xff000000000000) >> 0x28 |
                      (uStack_1478 & 0xff0000000000) >> 0x18 | (uStack_1478 & 0xff00000000) >> 8 |
                      (uStack_1478 & 0xff000000) << 8 | (uStack_1478 & 0xff0000) << 0x18 |
                      (uStack_1478 & 0xff00) << 0x28 | uStack_1478 << 0x38;
        if (uVar12 != uStack_1470) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                  ,0x2c2);
          btree_reverse_iterator_test()::__test_pass = '\x01';
          if (uVar12 != uStack_1470) {
            __assert_fail("k == (uint64_t)c",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                          ,0x2c2,"void btree_reverse_iterator_test()");
          }
        }
        if (uVar20 != uStack_1478) {
          btree_reverse_iterator_test();
        }
        uVar12 = uVar12 + 0x10;
        uVar20 = uVar20 + 0x100;
      } while (uVar12 != 400);
      uVar12 = 0x170;
      uVar20 = 0x1700;
      do {
        bVar3 = btree_prev((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
        if (bVar3 != BTREE_RESULT_SUCCESS) goto LAB_00106b06;
        btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
        uStack_1470 = uStack_1470 >> 0x38 | (uStack_1470 & 0xff000000000000) >> 0x28 |
                      (uStack_1470 & 0xff0000000000) >> 0x18 | (uStack_1470 & 0xff00000000) >> 8 |
                      (uStack_1470 & 0xff000000) << 8 | (uStack_1470 & 0xff0000) << 0x18 |
                      (uStack_1470 & 0xff00) << 0x28 | uStack_1470 << 0x38;
        uStack_1478 = uStack_1478 >> 0x38 | (uStack_1478 & 0xff000000000000) >> 0x28 |
                      (uStack_1478 & 0xff0000000000) >> 0x18 | (uStack_1478 & 0xff00000000) >> 8 |
                      (uStack_1478 & 0xff000000) << 8 | (uStack_1478 & 0xff0000) << 0x18 |
                      (uStack_1478 & 0xff00) << 0x28 | uStack_1478 << 0x38;
        if (uVar12 != uStack_1470) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                  ,0x2cc);
          btree_reverse_iterator_test()::__test_pass = '\x01';
          if (uVar12 != uStack_1470) {
            __assert_fail("k == (uint64_t)c",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                          ,0x2cc,"void btree_reverse_iterator_test()");
          }
        }
        if (uVar20 != uStack_1478) {
          btree_reverse_iterator_test();
        }
        uVar12 = uVar12 - 0x10;
        uVar20 = uVar20 - 0x100;
      } while (uVar12 != 0x100);
      uVar12 = 0x120;
      uVar20 = 0x1200;
      do {
        bVar3 = btree_next((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
        if (bVar3 != BTREE_RESULT_SUCCESS) goto LAB_00106b0b;
        btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
        uStack_1470 = uStack_1470 >> 0x38 | (uStack_1470 & 0xff000000000000) >> 0x28 |
                      (uStack_1470 & 0xff0000000000) >> 0x18 | (uStack_1470 & 0xff00000000) >> 8 |
                      (uStack_1470 & 0xff000000) << 8 | (uStack_1470 & 0xff0000) << 0x18 |
                      (uStack_1470 & 0xff00) << 0x28 | uStack_1470 << 0x38;
        uStack_1478 = uStack_1478 >> 0x38 | (uStack_1478 & 0xff000000000000) >> 0x28 |
                      (uStack_1478 & 0xff0000000000) >> 0x18 | (uStack_1478 & 0xff00000000) >> 8 |
                      (uStack_1478 & 0xff000000) << 8 | (uStack_1478 & 0xff0000) << 0x18 |
                      (uStack_1478 & 0xff00) << 0x28 | uStack_1478 << 0x38;
        if (uVar12 != uStack_1470) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                  ,0x2d6);
          btree_reverse_iterator_test()::__test_pass = '\x01';
          if (uVar12 != uStack_1470) {
            __assert_fail("k == (uint64_t)c",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                          ,0x2d6,"void btree_reverse_iterator_test()");
          }
        }
        if (uVar20 != uStack_1478) {
          btree_reverse_iterator_test();
        }
        uVar12 = uVar12 + 0x10;
        uVar20 = uVar20 + 0x100;
      } while (uVar12 != 0x1c0);
      uVar12 = 0x1a0;
      uVar20 = 0x1a00;
      do {
        bVar3 = btree_prev((btree_iterator *)auStack_1458,&uStack_1470,&uStack_1478);
        if (bVar3 != BTREE_RESULT_SUCCESS) goto LAB_00106b10;
        btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
        uStack_1470 = uStack_1470 >> 0x38 | (uStack_1470 & 0xff000000000000) >> 0x28 |
                      (uStack_1470 & 0xff0000000000) >> 0x18 | (uStack_1470 & 0xff00000000) >> 8 |
                      (uStack_1470 & 0xff000000) << 8 | (uStack_1470 & 0xff0000) << 0x18 |
                      (uStack_1470 & 0xff00) << 0x28 | uStack_1470 << 0x38;
        uStack_1478 = uStack_1478 >> 0x38 | (uStack_1478 & 0xff000000000000) >> 0x28 |
                      (uStack_1478 & 0xff0000000000) >> 0x18 | (uStack_1478 & 0xff00000000) >> 8 |
                      (uStack_1478 & 0xff000000) << 8 | (uStack_1478 & 0xff0000) << 0x18 |
                      (uStack_1478 & 0xff00) << 0x28 | uStack_1478 << 0x38;
        if (uVar12 != uStack_1470) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                 );
          btree_reverse_iterator_test()::__test_pass = '\x01';
          if (uVar12 != uStack_1470) {
            __assert_fail("k == (uint64_t)c",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                          ,0x2e0,"void btree_reverse_iterator_test()");
          }
        }
        if (uVar20 != uStack_1478) {
          btree_reverse_iterator_test();
        }
        uVar12 = uVar12 - 0x10;
        uVar20 = uVar20 - 0x100;
      } while (uVar12 != 0x90);
      key_buf = &uStack_1470;
      bVar3 = btree_prev((btree_iterator *)auStack_1458,key_buf,&uStack_1478);
      handle = (btreeblk_handle *)(auStack_1458 + 0x68);
      btreeblk_end(handle);
      if (bVar3 == BTREE_RESULT_FAIL) {
        btree_iterator_free((btree_iterator *)auStack_1458);
        free(pbStack_1468);
        btreeblk_free((btreeblk_handle *)(auStack_1458 + 0x68));
        filemgr_close(pfStack_1460,true,(char *)0x0,(err_log_callback *)0x0);
        filemgr_shutdown();
        memleak_end();
        pcVar13 = "%s PASSED\n";
        if (btree_reverse_iterator_test()::__test_pass != '\0') {
          pcVar13 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar13,"btree reverse iterator test");
        return;
      }
      goto LAB_00106c42;
    }
  }
  else {
    btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
    btree_iterator_free((btree_iterator *)auStack_1458);
LAB_00106c05:
    btree_reverse_iterator_test();
LAB_00106c0a:
    btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
    btree_iterator_free((btree_iterator *)auStack_1458);
LAB_00106c21:
    btree_reverse_iterator_test();
LAB_00106c26:
    btreeblk_end((btreeblk_handle *)(auStack_1458 + 0x68));
    handle = (btreeblk_handle *)auStack_1458;
    btree_iterator_free((btree_iterator *)handle);
  }
  btree_reverse_iterator_test();
LAB_00106c42:
  btree_reverse_iterator_test();
  sprintf(load_test_next_kv::kk,"k%07lu",*extraout_RDX);
  sprintf(load_test_next_kv::vv,"v%07lu",*extraout_RDX);
  *extraout_RDX = *extraout_RDX + 1;
  *(char **)handle = load_test_next_kv::kk;
  *key_buf = (ulong)load_test_next_kv::vv;
  return;
LAB_00106b06:
  btree_reverse_iterator_test();
LAB_00106b0b:
  btree_reverse_iterator_test();
LAB_00106b10:
  btree_reverse_iterator_test();
LAB_00106b15:
  __assert_fail("k == (uint64_t)(c+10)*0x10",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btreeblock_test.cc"
                ,0x278,"void btree_reverse_iterator_test()");
}

Assistant:

void subblock_test()
{
    TEST_INIT();

    int i, j, k, r, nbtrees;
    int nodesize;
    int blocksize = 4096;
    char *fname = (char *) "./btreeblock_testfile";
    char keybuf[256], valuebuf[256], temp[256];
    filemgr_open_result result;
    btree_result br;
    bid_t bid;
    size_t subblock_no, idx;
    struct filemgr *file;
    struct btreeblk_handle bhandle;
    struct btree_kv_ops *ops;
    struct btree btree, btree_arr[64];
    struct filemgr_config fconfig;
    struct btree_meta meta;

    memset(&fconfig, 0, sizeof(fconfig));
    fconfig.blocksize = blocksize;
    fconfig.ncacheblock = 0;
    fconfig.options = FILEMGR_CREATE;
    fconfig.num_wal_shards = 8;
    ops = btree_kv_get_kb64_vb64(NULL);

    // btree initialization using large metadata test
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    meta.data = (void*)malloc(4096);

    meta.size = 120;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(is_subblock(btree.root_bid));
    subbid2bid(btree.root_bid, &subblock_no, &idx, &bid);
    TEST_CHK(subblock_no == 1);
    btreeblk_free(&bhandle);

    meta.size = 250;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(is_subblock(btree.root_bid));
    subbid2bid(btree.root_bid, &subblock_no, &idx, &bid);
    TEST_CHK(subblock_no == 2);
    btreeblk_free(&bhandle);

    meta.size = 510;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(is_subblock(btree.root_bid));
    subbid2bid(btree.root_bid, &subblock_no, &idx, &bid);
    TEST_CHK(subblock_no == 3);
    btreeblk_free(&bhandle);

    meta.size = 1020;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(is_subblock(btree.root_bid));
    subbid2bid(btree.root_bid, &subblock_no, &idx, &bid);
    TEST_CHK(subblock_no == 4);
    btreeblk_free(&bhandle);

    meta.size = 2040;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(!is_subblock(btree.root_bid));
    btreeblk_free(&bhandle);

    meta.size = 4090;
    btreeblk_init(&bhandle, file, blocksize);
    br = btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, &meta);
    TEST_CHK(br == BTREE_RESULT_FAIL);

    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();
    free(meta.data);

    // coverage: enlarge case 1-1
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    for (i=0;i<256;++i){
        sprintf(keybuf, "%08d", i);
        sprintf(valuebuf, "%08x", i);
        btree_insert(&btree, (void*)keybuf, (void*)valuebuf);
        btreeblk_end(&bhandle);
        for (j=0;j<=i;++j){
            sprintf(keybuf, "%08d", j);
            sprintf(valuebuf, "%08x", j);
            btree_find(&btree, (void*)keybuf, (void*)temp);
            btreeblk_end(&bhandle);
            TEST_CHK(!memcmp(valuebuf, temp, strlen(valuebuf)));
        }
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    // coverage: enlarge case 1-2, move case 1
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    btree_init(&btree, (void*)&bhandle, btreeblk_get_ops(), ops,
               blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    for (i=0;i<256;++i){
        sprintf(keybuf, "%08d", i);
        sprintf(valuebuf, "%08x", i);
        btree_insert(&btree, (void*)keybuf, (void*)valuebuf);
        btreeblk_end(&bhandle);
        filemgr_commit(file, true, NULL);
        for (j=0;j<=i;++j){
            sprintf(keybuf, "%08d", j);
            sprintf(valuebuf, "%08x", j);
            btree_find(&btree, (void*)keybuf, (void*)temp);
            btreeblk_end(&bhandle);
            TEST_CHK(!memcmp(valuebuf, temp, strlen(valuebuf)));
        }
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    // coverage: enlarge case 1-1, 2-1, 2-2, 3-1
    nbtrees = 2;
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    for (i=0;i<nbtrees;++i){
        btree_init(&btree_arr[i], (void*)&bhandle, btreeblk_get_ops(), ops,
                   blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    }
    for (i=0;i<256;++i){
        for (j=0;j<nbtrees;++j){
            sprintf(keybuf, "%02d%06d", j, i);
            sprintf(valuebuf, "%02d%06x", j, i);
            btree_insert(&btree_arr[j], (void*)keybuf, (void*)valuebuf);
            btreeblk_end(&bhandle);
            for (k=0;k<=i;++k){
                sprintf(keybuf, "%02d%06d", j, k);
                sprintf(valuebuf, "%02d%06x", j, k);
                btree_find(&btree_arr[j], (void*)keybuf, (void*)temp);
                btreeblk_end(&bhandle);
                TEST_CHK(!memcmp(valuebuf, temp, strlen(valuebuf)));
            }
        }
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    // coverage: enlarge case 1-2, 2-1, 3-1, move case 1, 2-1, 2-2
    nbtrees = 2;
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    for (i=0;i<nbtrees;++i){
        btree_init(&btree_arr[i], (void*)&bhandle, btreeblk_get_ops(), ops,
                   blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    }
    for (i=0;i<256;++i){
        for (j=0;j<nbtrees;++j){
            sprintf(keybuf, "%02d%06d", j, i);
            sprintf(valuebuf, "%02d%06x", j, i);
            btree_insert(&btree_arr[j], (void*)keybuf, (void*)valuebuf);
            btreeblk_end(&bhandle);
        }
        filemgr_commit(file, true, NULL);
        for (j=0;j<nbtrees;++j){
            for (k=0;k<=i;++k){
                sprintf(keybuf, "%02d%06d", j, k);
                sprintf(valuebuf, "%02d%06x", j, k);
                btree_find(&btree_arr[j], (void*)keybuf, (void*)temp);
                btreeblk_end(&bhandle);
                TEST_CHK(!memcmp(valuebuf, temp, strlen(valuebuf)));
            }
        }
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    // coverage: enlarge case 1-1, 2-1, 3-2, move case 1, 2-1
    nbtrees = 7;
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    for (i=0;i<nbtrees;++i){
        btree_init(&btree_arr[i], (void*)&bhandle, btreeblk_get_ops(), ops,
                   blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    }
    for (j=0;j<nbtrees;++j){
        nodesize = 128 * (1<<j);
        for (i=0;i<(nodesize-16)/16;++i){
            sprintf(keybuf, "%02d%06d", j, i);
            sprintf(valuebuf, "%02d%06x", j, i);
            btree_insert(&btree_arr[j], (void*)keybuf, (void*)valuebuf);
            btreeblk_end(&bhandle);
        }
        filemgr_commit(file, true, NULL);
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    // coverage: enlarge case 1-1, 1-2, 2-1, 3-2, move case 1, 2-1
    nbtrees = 7;
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    result = filemgr_open(fname, get_filemgr_ops(), &fconfig, NULL);
    file = result.file;
    btreeblk_init(&bhandle, file, blocksize);
    for (i=0;i<nbtrees;++i){
        btree_init(&btree_arr[i], (void*)&bhandle, btreeblk_get_ops(), ops,
                   blocksize, sizeof(uint64_t), sizeof(uint64_t), 0x0, NULL);
    }
    for (j=0;j<nbtrees;++j){
        nodesize = 128 * (1<<j);
        for (i=0;i<(nodesize-16)/16;++i){
            sprintf(keybuf, "%02d%06d", j, i);
            sprintf(valuebuf, "%02d%06x", j, i);
            btree_insert(&btree_arr[j], (void*)keybuf, (void*)valuebuf);
            btreeblk_end(&bhandle);
            filemgr_commit(file, true, NULL);
        }
    }
    btreeblk_free(&bhandle);
    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    free(ops);
    TEST_RESULT("subblock test");
}